

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::PassRegistry::createPass(PassRegistry *this,string *name)

{
  iterator iVar1;
  mapped_type *pmVar2;
  Pass *pPVar3;
  key_type *in_RDX;
  undefined1 local_1a8 [392];
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
                  *)name,in_RDX);
  if (iVar1._M_node == (_Base_ptr)&name->_M_string_length) {
    Fatal::Fatal((Fatal *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a8 + 0x10),"Could not find pass: ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1a8 + 0x10),(in_RDX->_M_dataplus)._M_p,in_RDX->_M_string_length);
    Fatal::operator<<((Fatal *)local_1a8,(char (*) [2])0xe3236f);
    Fatal::~Fatal((Fatal *)local_1a8);
  }
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wasm::PassRegistry::PassInfo>_>_>
                         *)name,in_RDX);
  if ((pmVar2->create).super__Function_base._M_manager != (_Manager_type)0x0) {
    pPVar3 = (*(pmVar2->create)._M_invoker)((_Any_data *)&pmVar2->create);
    *(Pass **)&(this->passInfos)._M_t._M_impl = pPVar3;
    std::__cxx11::string::_M_assign((string *)&pPVar3->name);
    return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
           (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
  }
  std::__throw_bad_function_call();
}

Assistant:

std::unique_ptr<Pass> PassRegistry::createPass(std::string name) {
  if (passInfos.find(name) == passInfos.end()) {
    Fatal() << "Could not find pass: " << name << "\n";
  }
  std::unique_ptr<Pass> ret;
  ret.reset(passInfos[name].create());
  ret->name = name;
  return ret;
}